

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O1

void __thiscall t_cl_generator::package_def(t_cl_generator *this,ostream *out)

{
  t_program *ptVar1;
  pointer pptVar2;
  long *plVar3;
  char *this_00;
  pointer pptVar4;
  string local_48;
  
  ptVar1 = (this->super_t_oop_generator).super_t_generator.program_;
  this_00 = "(thrift:def-package :";
  std::__ostream_insert<char,std::char_traits<char>>(out,"(thrift:def-package :",0x15);
  package_of_abi_cxx11_
            (&local_48,(t_cl_generator *)this_00,
             (this->super_t_oop_generator).super_t_generator.program_);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>(out," :use (",7);
    pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pptVar4 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pptVar4 != pptVar2;
        pptVar4 = pptVar4 + 1) {
      ptVar1 = *pptVar4;
      std::__ostream_insert<char,std::char_traits<char>>(out," :",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,(ptVar1->name_)._M_dataplus._M_p,(ptVar1->name_)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + (char)out);
  std::ostream::put((char)out);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void t_cl_generator::package_def(std::ostream &out) {
  const vector<t_program*>& includes = program_->get_includes();

  out << "(thrift:def-package :" << package();
  if ( includes.size() > 0 ) {
    out << " :use (";
    for (auto include : includes) {
      out << " :" << include->get_name();
    }
    out << ")";
  }
  out << ")" << endl << endl;
}